

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O0

BOOL __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::IsInFreeObjectList
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this,void *objectAddress)

{
  FreeObject *local_28;
  FreeObject *freeObject;
  void *objectAddress_local;
  SmallHeapBlockT<MediumAllocationBlockAttributes> *this_local;
  
  local_28 = this->freeObjectList;
  while( true ) {
    if (local_28 == (FreeObject *)0x0) {
      return 0;
    }
    if (local_28 == (FreeObject *)objectAddress) break;
    local_28 = FreeObject::GetNext(local_28);
  }
  return 1;
}

Assistant:

BOOL
SmallHeapBlockT<TBlockAttributes>::IsInFreeObjectList(void * objectAddress)
{
    FreeObject * freeObject = this->freeObjectList;
    while (freeObject != nullptr)
    {
        if (freeObject == objectAddress)
        {
            return true;
        }
        freeObject = freeObject->GetNext();
    }
    return false;
}